

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O2

void __thiscall Manifold_DecomposeProps_Test::TestBody(Manifold_DecomposeProps_Test *this)

{
  Manifold *pMVar1;
  Manifold *manifold;
  Manifold *out;
  initializer_list<MeshSize> __l;
  allocator_type local_1b9;
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  input;
  Manifold manifolds;
  vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> manifoldList;
  Manifold sphere;
  Manifold cube;
  Manifold tet;
  _Vector_base<MeshSize,_std::allocator<MeshSize>_> local_120;
  Manifold *local_108;
  Manifold *pMStack_100;
  pointer local_f8;
  pointer pfStack_f0;
  pointer local_e8;
  pointer puStack_e0;
  
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  input.
  super__Vector_base<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  manifoldList.super__Vector_base<manifold::Manifold,_std::allocator<manifold::Manifold>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::manifold::Manifold::Tetrahedron();
  WithPositionColors(&tet);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&manifoldList,&tet);
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&input,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::Manifold::Cube(&local_108,0);
  WithPositionColors(&cube);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&manifoldList,&cube);
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&input,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::Manifold::Sphere(1.0,(int)&local_108);
  WithPositionColors(&sphere);
  ::manifold::Manifold::~Manifold((Manifold *)&local_108);
  std::vector<manifold::Manifold,std::allocator<manifold::Manifold>>::
  emplace_back<manifold::Manifold&>
            ((vector<manifold::Manifold,std::allocator<manifold::Manifold>> *)&manifoldList,&sphere)
  ;
  ::manifold::Manifold::GetMeshGL((int)&local_108);
  std::
  vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
  ::emplace_back<manifold::MeshGLP<float,unsigned_int>>
            ((vector<manifold::MeshGLP<float,unsigned_int>,std::allocator<manifold::MeshGLP<float,unsigned_int>>>
              *)&input,(MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&local_108);
  ::manifold::Manifold::Compose((vector *)&manifolds);
  local_e8 = (pointer)0x400000004;
  puStack_e0 = (pointer)0x400000003;
  local_f8 = (pointer)0x800000006;
  pfStack_f0 = (pointer)0x600000003;
  local_108 = (Manifold *)0xc00000008;
  pMStack_100 = (Manifold *)0x800000003;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_108;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector
            ((vector<MeshSize,_std::allocator<MeshSize>_> *)&local_120,__l,&local_1b9);
  ExpectMeshes(&manifolds,(vector<MeshSize,_std::allocator<MeshSize>_> *)&local_120);
  std::_Vector_base<MeshSize,_std::allocator<MeshSize>_>::~_Vector_base(&local_120);
  RelatedGL(&manifolds,&input,false,false);
  ::manifold::Manifold::Decompose();
  pMVar1 = pMStack_100;
  for (out = local_108; out != pMVar1; out = out + 0x10) {
    RelatedGL(out,&input,false,false);
  }
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector
            ((vector<manifold::Manifold,_std::allocator<manifold::Manifold>_> *)&local_108);
  ::manifold::Manifold::~Manifold(&manifolds);
  ::manifold::Manifold::~Manifold(&sphere);
  ::manifold::Manifold::~Manifold(&cube);
  ::manifold::Manifold::~Manifold(&tet);
  std::vector<manifold::Manifold,_std::allocator<manifold::Manifold>_>::~vector(&manifoldList);
  std::
  vector<manifold::MeshGLP<float,_unsigned_int>,_std::allocator<manifold::MeshGLP<float,_unsigned_int>_>_>
  ::~vector(&input);
  return;
}

Assistant:

TEST(Manifold, ValidInput) {
  MeshGL tetGL = TetGL();
  Manifold tet(tetGL);
  EXPECT_FALSE(tet.IsEmpty());
  EXPECT_EQ(tet.Status(), Manifold::Error::NoError);
}